

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DearchiverVkImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::DearchiverVkImpl> *this,DearchiverVkImpl *pObj)

{
  char (*in_RCX) [26];
  string msg;
  string local_28;
  
  this->m_pObject = pObj;
  if (pObj != (DearchiverVkImpl *)0x0) {
    if ((pObj->super_DearchiverBase).super_ObjectBase<Diligent::IDearchiver>.
        super_RefCountedObject<Diligent::IDearchiver>.m_pRefCounters == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_28,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef
              ((pObj->super_DearchiverBase).super_ObjectBase<Diligent::IDearchiver>.
               super_RefCountedObject<Diligent::IDearchiver>.m_pRefCounters);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }